

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

void __thiscall Centaurus::DFA<wchar_t>::fork_states(DFA<wchar_t> *this,int index,NFA<wchar_t> *nfa)

{
  pointer pDVar1;
  int *piVar2;
  pointer pNVar3;
  pointer pNVar4;
  int dest;
  long lVar5;
  NFATransition<wchar_t> *tr;
  NFATransition<wchar_t> *tr_00;
  int *piVar6;
  pointer cc;
  ulong uVar7;
  bool long_flag;
  NFA<wchar_t> *local_b8;
  long local_b0;
  long local_a8;
  NFADepartureSet<wchar_t> deptset;
  NFADepartureSetFactory<wchar_t> ds_factory;
  set<int,_std::less<int>,_std::allocator<int>_> ec;
  
  ds_factory._vptr_NFADepartureSetFactory = (_func_int **)&PTR__NFADepartureSetFactory_001a0228;
  ds_factory.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ds_factory.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ds_factory.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = (long)index;
  pDVar1 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = lVar5 * 0x48;
  piVar2 = *(pointer *)
            ((long)&pDVar1[lVar5].super_NFABaseState<wchar_t,_Centaurus::IndexVector>.m_label.
                    super_vector<int,_std::allocator<int>_> + 8);
  local_b8 = nfa;
  for (piVar6 = pDVar1[lVar5].super_NFABaseState<wchar_t,_Centaurus::IndexVector>.m_label.
                super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
    pNVar3 = (local_b8->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar4 = *(pointer *)
              ((long)&pNVar3[*piVar6].m_transitions.
                      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                      ._M_impl + 8);
    for (tr_00 = *(NFATransition<wchar_t> **)
                  &pNVar3[*piVar6].m_transitions.
                   super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                   ._M_impl; tr_00 != pNVar4; tr_00 = tr_00 + 1) {
      NFADepartureSetFactory<wchar_t>::add(&ds_factory,tr_00);
    }
  }
  NFADepartureSetFactory<wchar_t>::build_departure_set(&deptset,&ds_factory);
  local_b0 = ((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                   super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  for (cc = deptset.
            super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            .
            super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      cc != deptset.
            super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            .
            super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; cc = cc + 1) {
    long_flag = false;
    NFA<wchar_t>::epsilon_closure
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&ec._M_t,local_b8,&cc->second,
               &long_flag);
    dest = add_state(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&ec._M_t,long_flag);
    NFABaseState<wchar_t,_Centaurus::IndexVector>::add_transition
              ((NFABaseState<wchar_t,_Centaurus::IndexVector> *)
               ((long)&(((this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                         super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_NFABaseState<wchar_t,_Centaurus::IndexVector>)._vptr_NFABaseState +
               local_a8),&cc->first,dest,false);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&ec._M_t);
  }
  for (uVar7 = (ulong)(int)local_b0;
      uVar7 < (ulong)(((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                             super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                            super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48); uVar7 = uVar7 + 1) {
    fork_states(this,(int)uVar7,local_b8);
  }
  std::
  vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~vector(&deptset.
             super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           );
  NFADepartureSetFactory<wchar_t>::~NFADepartureSetFactory(&ds_factory);
  return;
}

Assistant:

void fork_states(int index, const NFA<TCHAR>& nfa)
	{
		NFADepartureSetFactory<TCHAR> ds_factory;

		for (int i : m_states[index].label())
		{
			for (const auto& tr : nfa.get_transitions(i))
			{
				ds_factory.add(tr);
			}
		}

		NFADepartureSet<TCHAR> deptset = ds_factory.build_departure_set();

		int initial_index = m_states.size();
		for (const auto& item : deptset)
		{
            bool long_flag = false;
			std::set<int> ec = nfa.epsilon_closure(item.second, long_flag);

			int new_index = add_state(ec, long_flag);

			//std::cout << "S" << index << "->" << new_index << std::endl;

			m_states[index].add_transition(item.first, new_index);
		}

		for (int i = initial_index; i < m_states.size(); i++)
		{
			fork_states(i, nfa);
		}
	}